

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFExc.hh
# Opt level: O0

void __thiscall QPDFExc::~QPDFExc(QPDFExc *this)

{
  QPDFExc *this_local;
  
  *(undefined ***)this = &PTR__QPDFExc_0058ab98;
  std::__cxx11::string::~string((string *)&this->message);
  std::__cxx11::string::~string((string *)&this->object);
  std::__cxx11::string::~string((string *)&this->filename);
  std::runtime_error::~runtime_error(&this->super_runtime_error);
  return;
}

Assistant:

~QPDFExc() noexcept override = default;